

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperFunctions.cpp
# Opt level: O2

vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
* dgrminer::find_maximal_subsets_of_ndve
            (vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
             *__return_storage_ptr__,
            vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
            *sets)

{
  pointer pnVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  _Base_ptr p_Var5;
  pointer pnVar6;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  __normal_iterator<dgrminer::non_dummy_vertices_and_edges_*,_std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>
  __i;
  pointer pnVar14;
  long lVar15;
  long lVar16;
  size_t i_1;
  ulong uVar17;
  ulong uVar18;
  ulong local_1e0;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  newbucked_ndve;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  buckets;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  output;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  bucket_ndve;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  bucket;
  vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  buckets_ndve;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  vectors;
  vector<int,_std::allocator<int>_> currentSet;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  testBucket;
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  currentBucket_ndve;
  vector<int,_std::allocator<int>_> vec;
  vector<int,_std::allocator<int>_> testSet;
  
  output.
  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  output.
  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  output.
  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets_ndve.
  super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets.
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets_ndve.
  super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buckets_ndve.
  super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pnVar6 = (sets->
           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pnVar1 = (sets->
           super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = ((long)pnVar1 - (long)pnVar6) / 0x60;
  if (uVar4 < 2) {
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_start = pnVar6;
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_finish = pnVar1;
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         (sets->
         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
         )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (sets->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (sets->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (sets->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    if (pnVar6 != pnVar1) {
      lVar15 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<dgrminer::non_dummy_vertices_and_edges*,std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_ndve(std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>)::__0>>
                (pnVar6,pnVar1,((uint)lVar15 ^ 0x3f) * 2 ^ 0x7e);
      if ((long)pnVar1 - (long)pnVar6 < 0x601) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dgrminer::non_dummy_vertices_and_edges*,std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_ndve(std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>)::__0>>
                  (pnVar6,pnVar1);
      }
      else {
        pnVar14 = pnVar6 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<dgrminer::non_dummy_vertices_and_edges*,std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>>,__gnu_cxx::__ops::_Iter_comp_iter<dgrminer::find_maximal_subsets_of_ndve(std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>)::__0>>
                  (pnVar6,pnVar14);
        for (; pnVar14 != pnVar1; pnVar14 = pnVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<dgrminer::non_dummy_vertices_and_edges*,std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>>,__gnu_cxx::__ops::_Val_comp_iter<dgrminer::find_maximal_subsets_of_ndve(std::vector<dgrminer::non_dummy_vertices_and_edges,std::allocator<dgrminer::non_dummy_vertices_and_edges>>)::__0>>
                    (pnVar14);
        }
      }
    }
    vectors.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vectors.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vectors.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    for (uVar4 = 0;
        pnVar6 = (sets->
                 super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                 )._M_impl.super__Vector_impl_data._M_start,
        uVar4 < (ulong)(((long)(sets->
                               super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar6) / 0x60);
        uVar4 = uVar4 + 1) {
      vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           (pointer)0x0;
      vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
           (pointer)0x0;
      p_Var5 = *(_Base_ptr *)((long)&pnVar6[uVar4].non_dummy_edges._M_t._M_impl + 0x18);
      while (p_Var5 != (_Rb_tree_node_base *)
                       ((long)&pnVar6[uVar4].non_dummy_edges._M_t._M_impl + 8U)) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)
                   &vec.super__Vector_base<int,_std::allocator<int>_>,
                   (value_type_conflict *)(p_Var5 + 1));
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        pnVar6 = (sets->
                 super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&vectors,(value_type *)&vec.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&vec.super__Vector_base<int,_std::allocator<int>_>);
    }
    local_1e0 = (ulong)((long)((vectors.
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)((vectors.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_start) >> 2;
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bucket.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bucket_ndve.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    bucket_ndve.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bucket_ndve.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar16 = 0;
    lVar15 = 0;
    for (uVar4 = 0;
        uVar4 < (ulong)(((long)vectors.
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)vectors.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1)
    {
      uVar17 = *(long *)((long)&((vectors.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish + lVar16) -
               *(long *)((long)&((vectors.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start + lVar16) >> 2;
      if (uVar17 == (long)(int)local_1e0) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(&bucket,(value_type *)
                            ((long)&((vectors.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar16));
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::push_back(&bucket_ndve,
                    (value_type *)
                    ((long)&(((sets->
                              super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                              )._M_impl.super__Vector_impl_data._M_start)->non_dummy_vertices)._M_t.
                            _M_impl + lVar15));
      }
      else {
        std::
        vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
        ::push_back(&buckets,&bucket);
        std::
        vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
        ::push_back(&buckets_ndve,&bucket_ndve);
        vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)0x0;
        vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        newbucked_ndve.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        newbucked_ndve.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        newbucked_ndve.
        super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&bucket,(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)&vec);
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::operator=(&bucket_ndve,&newbucked_ndve);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(&bucket,(value_type *)
                            ((long)&((vectors.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_start + lVar16));
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::push_back(&bucket_ndve,
                    (value_type *)
                    ((long)&(((sets->
                              super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                              )._M_impl.super__Vector_impl_data._M_start)->non_dummy_vertices)._M_t.
                            _M_impl + lVar15));
        std::
        vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
        ::~vector(&newbucked_ndve);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)&vec);
        local_1e0 = uVar17;
      }
      lVar15 = lVar15 + 0x60;
      lVar16 = lVar16 + 0x18;
    }
    std::
    vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
    ::push_back(&buckets,&bucket);
    std::
    vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
    ::push_back(&buckets_ndve,&bucket_ndve);
    lVar15 = 0;
    for (uVar4 = 0;
        uVar4 < (ulong)(((long)((buckets.
                                 super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                        (long)((buckets.
                                super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1
        ) {
      std::
      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
      ::push_back(&output,(value_type *)
                          ((long)&((((buckets_ndve.
                                      super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->non_dummy_vertices)
                                  ._M_t._M_impl + lVar15));
      lVar15 = lVar15 + 0x60;
    }
    for (uVar4 = 1;
        uVar4 < (ulong)(((long)buckets.
                               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)buckets.
                              super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar4 = uVar4 + 1)
    {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&newbucked_ndve,
               buckets.
               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar4);
      std::
      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
      ::vector(&currentBucket_ndve,
               buckets_ndve.
               super__Vector_base<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar4);
      uVar17 = 0;
LAB_00144906:
      if (uVar17 < (ulong)(((long)newbucked_ndve.
                                  super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)newbucked_ndve.
                                 super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
        std::vector<int,_std::allocator<int>_>::vector
                  (&currentSet,
                   (vector<int,_std::allocator<int>_> *)
                   (&((newbucked_ndve.
                       super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                       ._M_impl.super__Vector_impl_data._M_start)->non_dummy_vertices)._M_t._M_impl.
                     field_0x0 + uVar17 * 0x18));
        non_dummy_vertices_and_edges::non_dummy_vertices_and_edges
                  ((non_dummy_vertices_and_edges *)&vec,
                   currentBucket_ndve.
                   super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar17);
        if (currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_finish !=
            currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start) {
          bVar3 = true;
          uVar18 = 0;
LAB_00144965:
          if (uVar18 != uVar4) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::vector(&testBucket,
                     buckets.
                     super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar18);
            uVar8 = 0;
            bVar2 = bVar3;
LAB_00144986:
            bVar3 = bVar2;
            if (uVar8 < (ulong)(((long)testBucket.
                                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)testBucket.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
              std::vector<int,_std::allocator<int>_>::vector
                        ((vector<int,_std::allocator<int>_> *)
                         &testSet.super__Vector_base<int,_std::allocator<int>_>,
                         testBucket.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar8);
              uVar7 = (long)currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              uVar9 = (long)testSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)testSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2;
              uVar10 = 0;
              uVar11 = 0;
              uVar12 = 0;
LAB_001449ef:
              do {
                if (uVar10 == uVar7) goto LAB_00144a2a;
                uVar12 = (ulong)(int)uVar12;
                uVar13 = uVar12;
                if (uVar12 < uVar9) {
                  uVar13 = uVar9;
                }
                for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
                  if (currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10] <
                      testSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12]) goto LAB_00144a2a;
                  if (currentSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar10] ==
                      testSet.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12]) {
                    uVar11 = (ulong)((int)uVar11 + 1);
                    uVar10 = uVar10 + 1;
                    if (uVar7 != uVar11) goto LAB_001449ef;
                    bVar3 = false;
                    goto LAB_00144a2a;
                  }
                }
                uVar10 = uVar10 + 1;
                uVar12 = uVar13;
              } while( true );
            }
            goto LAB_00144a46;
          }
          goto LAB_00144a5f;
        }
        goto LAB_00144a87;
      }
      std::
      vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
      ::~vector(&currentBucket_ndve);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&newbucked_ndve);
    }
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_start =
         output.
         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_finish =
         output.
         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage =
         output.
         super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    output.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    output.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    output.
    super__Vector_base<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ::~vector(&bucket_ndve);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&bucket);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&vectors);
  }
  std::
  vector<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>,_std::allocator<std::vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>_>_>
  ::~vector(&buckets_ndve);
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::~vector(&buckets);
  std::
  vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
  ::~vector(&output);
  return __return_storage_ptr__;
LAB_00144a2a:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&testSet.super__Vector_base<int,_std::allocator<int>_>);
  uVar8 = uVar8 + 1;
  bVar2 = bVar3;
  if (!bVar3) goto code_r0x00144a3f;
  goto LAB_00144986;
code_r0x00144a3f:
  bVar2 = false;
LAB_00144a46:
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&testBucket);
  uVar18 = uVar18 + 1;
  if (!bVar2) goto LAB_00144a5f;
  goto LAB_00144965;
LAB_00144a5f:
  if (bVar3) {
    std::
    vector<dgrminer::non_dummy_vertices_and_edges,_std::allocator<dgrminer::non_dummy_vertices_and_edges>_>
    ::push_back(&output,(value_type *)&vec);
  }
LAB_00144a87:
  non_dummy_vertices_and_edges::~non_dummy_vertices_and_edges((non_dummy_vertices_and_edges *)&vec);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&currentSet.super__Vector_base<int,_std::allocator<int>_>);
  uVar17 = uVar17 + 1;
  goto LAB_00144906;
}

Assistant:

std::vector<non_dummy_vertices_and_edges>
    find_maximal_subsets_of_ndve(std::vector<non_dummy_vertices_and_edges> sets)
    {

        std::vector<non_dummy_vertices_and_edges> output;
        // in regular buckets we keep the sets of edges; they are used in the main algorithm
        std::vector<std::vector<std::vector<int>>> buckets;
        // in buckets_ndve we keep together edges and vertices; these will be used for output
        std::vector<std::vector<non_dummy_vertices_and_edges>> buckets_ndve;


        if (sets.size() <= 1)
        { return sets; }

        // sort the vector by descending length
        std::sort(sets.begin(), sets.end(),
                  [](non_dummy_vertices_and_edges x, non_dummy_vertices_and_edges y) -> int {
                      return (x.non_dummy_edges.size() > y.non_dummy_edges.size());
                  });

        // transform sets into vectors:
        std::vector<std::vector<int>> vectors;
        for (size_t i = 0; i < sets.size(); i++)
        {
            std::vector<int> vec;
            for (std::set<int>::iterator j = sets[i].non_dummy_edges.begin(); j != sets[i].non_dummy_edges.end(); j++)
            {
                vec.push_back(*j);
            }
            vectors.push_back(vec);
        }


        int length = vectors[0].size();
        std::vector<std::vector<int>> bucket; //current bucket
        std::vector<non_dummy_vertices_and_edges> bucket_ndve; //current bucket

        //Place each set with shared length in its own bucket
        for (size_t i = 0; i < vectors.size(); i++)
        {
            if (vectors[i].size() == length)//current Bucket
            {
                bucket.push_back(vectors[i]);
                bucket_ndve.push_back(sets[i]);
            }
            else//new Bucket
            {
                length = vectors[i].size();
                buckets.push_back(bucket);
                buckets_ndve.push_back(bucket_ndve);
                std::vector<std::vector<int>> newbucked;
                std::vector<non_dummy_vertices_and_edges> newbucked_ndve;
                bucket = newbucked;
                bucket_ndve = newbucked_ndve;
                bucket.push_back(vectors[i]);
                bucket_ndve.push_back(sets[i]);
            }
        }
        buckets.push_back(bucket);
        buckets_ndve.push_back(bucket_ndve);

        //Based on the assumption of uniqueness, everything in the first bucket is
        //larger than every other set and since it is unique, they are not proper subsets
        for (size_t i = 0; i < buckets[0].size(); i++)
        {
            //output.push_back(buckets[0][i]);
            output.push_back(buckets_ndve[0][i]);
        }

        //Iterate through the buckets
        for (int i = 1; i < buckets.size(); i++)
        {
            std::vector<std::vector<int>> currentBucket = buckets[i];
            std::vector<non_dummy_vertices_and_edges> currentBucket_ndve = buckets_ndve[i];

            //Iterate through the sets in the current bucket
            for (int a = 0; a < currentBucket.size(); a++)
            {
                std::vector<int> currentSet = currentBucket[a]; // this set can be potentially added
                non_dummy_vertices_and_edges currentSet_ndve = currentBucket_ndve[a];


                // if the current set is empty and we got here, then there is another set which is a superset of this empty set
                if (currentSet.size() == 0)
                { continue; }

                bool addSet = true;

                //Iterate through buckets with greater length
                for (int b = 0; b < i; b++)
                {
                    std::vector<std::vector<int>> testBucket = buckets[b]; // here can be potentially a super set of the currentSet


                    //Iterate through the sets in testBucket
                    for (int c = 0; c < testBucket.size(); c++)
                    {
                        std::vector<int> testSet = testBucket[c]; // this can be potentially a super set of the currentSet
                        int testMatches = 0;

                        bool setClear = false; // my addition
                        int testIndex = 0;
                        //Iterate through the values in the current set
                        for (int d = 0; d < currentSet.size(); d++)
                        {

                            //Iterate through the values in the test set
                            for (; testIndex < testSet.size(); testIndex++)
                            {
                                if (currentSet[d] < testSet[testIndex])
                                {
                                    setClear = true;
                                    break;
                                }
                                if (currentSet[d] == testSet[testIndex])
                                {
                                    testMatches++;
                                    if (testMatches == currentSet.size())
                                    {
                                        // SAME LENGTH
                                        addSet = false;
                                        setClear = true;
                                    }
                                    break;
                                }
                            }//testIndex
                            if (setClear)
                            { break; }
                        }//d
                        if (!addSet)
                        { break; }
                    }//c
                    if (!addSet)
                    { break; }
                }//b
                if (addSet)
                { output.push_back(currentSet_ndve); }
            }//a
        }//i


        return output;
    }